

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O1

void jpeg_set_linear_quality(j_compress_ptr cinfo,int scale_factor,boolean force_baseline)

{
  jpeg_add_quant_table(cinfo,0,std_luminance_quant_tbl,scale_factor,force_baseline);
  jpeg_add_quant_table(cinfo,1,std_chrominance_quant_tbl,scale_factor,force_baseline);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_linear_quality(j_compress_ptr cinfo, int scale_factor,
                        boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables
 * and a straight percentage-scaling quality scale.  In most cases it's better
 * to use jpeg_set_quality (below); this entry point is provided for
 * applications that insist on a linear percentage scaling.
 */
{
  /* Set up two quantization tables using the specified scaling */
  jpeg_add_quant_table(cinfo, 0, std_luminance_quant_tbl,
                       scale_factor, force_baseline);
  jpeg_add_quant_table(cinfo, 1, std_chrominance_quant_tbl,
                       scale_factor, force_baseline);
}